

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O1

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::ForeachLoopStatement>
          (ASTSerializer *this,ForeachLoopStatement *elem,bool inMembersArray)

{
  StatementSyntax *this_00;
  SourceManager *this_01;
  char *__s;
  SourceLocation SVar1;
  SourceLocation SVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  SourceRange SVar6;
  string_view sVar7;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar8;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view value;
  string_view name_05;
  bool local_41;
  SourceLocation local_40;
  SourceLocation local_38;
  
  JsonWriter::startObject(this->writer);
  this_00 = (elem->super_Statement).syntax;
  if (((this_00 != (StatementSyntax *)0x0) && (this->includeSourceInfo == true)) &&
     (this_01 = this->compilation->sourceManager, this_01 != (SourceManager *)0x0)) {
    SVar6 = slang::syntax::SyntaxNode::sourceRange(&this_00->super_SyntaxNode);
    SVar1 = SourceManager::getFullyExpandedLoc(this_01,SVar6.startLoc);
    local_38 = SVar1;
    SVar2 = SourceManager::getFullyExpandedLoc(this_01,SVar6.endLoc);
    local_40 = SVar2;
    sVar7 = SourceManager::getFileName(this_01,SVar1);
    name._M_str = "source_file_start";
    name._M_len = 0x11;
    JsonWriter::writeProperty(this->writer,name);
    JsonWriter::writeValue(this->writer,sVar7);
    sVar7 = SourceManager::getFileName(this_01,SVar2);
    name_00._M_str = "source_file_end";
    name_00._M_len = 0xf;
    JsonWriter::writeProperty(this->writer,name_00);
    JsonWriter::writeValue(this->writer,sVar7);
    SVar2 = local_38;
    sVar3 = SourceManager::getLineNumber(this_01,local_38);
    sVar7._M_str = "source_line_start";
    sVar7._M_len = 0x11;
    JsonWriter::writeProperty(this->writer,sVar7);
    JsonWriter::writeValue(this->writer,sVar3);
    SVar1 = local_40;
    sVar3 = SourceManager::getLineNumber(this_01,local_40);
    name_01._M_str = "source_line_end";
    name_01._M_len = 0xf;
    JsonWriter::writeProperty(this->writer,name_01);
    JsonWriter::writeValue(this->writer,sVar3);
    sVar3 = SourceManager::getColumnNumber(this_01,SVar2);
    name_02._M_str = "source_column_start";
    name_02._M_len = 0x13;
    JsonWriter::writeProperty(this->writer,name_02);
    JsonWriter::writeValue(this->writer,sVar3);
    sVar3 = SourceManager::getColumnNumber(this_01,SVar1);
    name_03._M_str = "source_column_end";
    name_03._M_len = 0x11;
    JsonWriter::writeProperty(this->writer,name_03);
    JsonWriter::writeValue(this->writer,sVar3);
  }
  __s = *(char **)(toString(slang::ast::StatementKind)::strings +
                  (long)(int)(elem->super_Statement).kind * 8);
  sVar4 = strlen(__s);
  name_04._M_str = "kind";
  name_04._M_len = 4;
  JsonWriter::writeProperty(this->writer,name_04);
  value._M_str = __s;
  value._M_len = sVar4;
  JsonWriter::writeValue(this->writer,value);
  sVar8 = Compilation::getAttributes(this->compilation,&elem->super_Statement);
  if (sVar8._M_extent._M_extent_value._M_extent_value != 0) {
    name_05._M_str = "attributes";
    name_05._M_len = 10;
    JsonWriter::writeProperty(this->writer,name_05);
    JsonWriter::startArray(this->writer);
    lVar5 = 0;
    do {
      local_41 = false;
      Symbol::visit<slang::ast::ASTSerializer&,bool&>
                (*(Symbol **)((long)sVar8._M_ptr + lVar5),this,&local_41);
      lVar5 = lVar5 + 8;
    } while (sVar8._M_extent._M_extent_value._M_extent_value << 3 != lVar5);
    JsonWriter::endArray(this->writer);
  }
  ForeachLoopStatement::serializeTo(elem,this);
  JsonWriter::endObject(this->writer);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}